

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase212::run(TestCase212 *this)

{
  Reader brand;
  undefined1 auVar1 [40];
  bool bVar2;
  StructSchema schema;
  Builder root;
  Builder field;
  Builder fields;
  IndexingIterator<capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Builder,_capnp::schema::Field::Builder>
  local_1e0;
  Builder type;
  Builder local_178;
  SchemaLoader loader;
  MallocMessageBuilder schemaBuilder;
  
  root._builder.capTable = (CapTableBuilder *)root._builder.segment;
  SchemaLoader::SchemaLoader(&loader);
  SchemaLoader::loadCompiledTypeAndDependencies<capnproto_test::capnp::test::TestNewVersion>
            (&loader);
  auVar1 = ZEXT1640(ZEXT816(0));
  brand._reader._40_8_ = 0x7fffffff;
  brand._reader.segment = (SegmentReader *)auVar1._0_8_;
  brand._reader.capTable = (CapTableReader *)auVar1._8_8_;
  brand._reader.data = (void *)auVar1._16_8_;
  brand._reader.pointers = (WirePointer *)auVar1._24_8_;
  brand._reader.dataSize = auVar1._32_4_;
  brand._reader.pointerCount = auVar1._36_2_;
  brand._reader._38_2_ = auVar1._38_2_;
  schemaBuilder.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)SchemaLoader::get(&loader,0x8ed75a7469f04ce3,brand,(Schema)0x674d40);
  schema = Schema::asStruct((Schema *)&schemaBuilder);
  local_178._builder.segment = (SegmentBuilder *)(schemas::s_8ed75a7469f04ce3 + 0x48);
  Schema::getProto((Reader *)&schemaBuilder,(Schema *)&local_178);
  kj::str<capnp::schema::Node::Reader>((String *)&root,(Reader *)&schemaBuilder);
  Schema::getProto((Reader *)&fields,&schema.super_Schema);
  kj::str<capnp::schema::Node::Reader>((String *)&field,(Reader *)&fields);
  if (field._builder.capTable == (CapTableBuilder *)0x0) {
    type._builder.segment = (SegmentBuilder *)0x514074;
  }
  else {
    type._builder.segment = field._builder.segment;
  }
  type._builder.capTable =
       (CapTableBuilder *)
       ((long)&((field._builder.capTable)->super_CapTableReader)._vptr_CapTableReader +
       (ulong)(field._builder.capTable == (CapTableBuilder *)0x0));
  bVar2 = kj::String::operator==((String *)&root,(StringPtr *)&type);
  kj::Array<char>::~Array((Array<char> *)&field);
  kj::Array<char>::~Array((Array<char> *)&root);
  if (!bVar2 && kj::_::Debug::minSeverity < 3) {
    type._builder.segment = (SegmentBuilder *)(schemas::s_8ed75a7469f04ce3 + 0x48);
    Schema::getProto((Reader *)&schemaBuilder,(Schema *)&type);
    kj::str<capnp::schema::Node::Reader>((String *)&root,(Reader *)&schemaBuilder);
    Schema::getProto((Reader *)&fields,&schema.super_Schema);
    kj::str<capnp::schema::Node::Reader>((String *)&field,(Reader *)&fields);
    kj::_::Debug::log<char_const(&)[108],kj::String,kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0xdb,ERROR,
               "\"failed: expected \" \"(kj::str(Schema::from<test::TestNewVersion>().getProto())) == (kj::str(schema.getProto()))\", kj::str(Schema::from<test::TestNewVersion>().getProto()), kj::str(schema.getProto())"
               ,(char (*) [108])
                "failed: expected (kj::str(Schema::from<test::TestNewVersion>().getProto())) == (kj::str(schema.getProto()))"
               ,(String *)&root,(String *)&field);
    kj::Array<char>::~Array((Array<char> *)&field);
    kj::Array<char>::~Array((Array<char> *)&root);
  }
  MallocMessageBuilder::MallocMessageBuilder(&schemaBuilder,0x400,GROW_HEURISTICALLY);
  root._builder.segment = (SegmentBuilder *)(schemas::s_95b30dd14e01dda8 + 0x48);
  Schema::getProto((Reader *)&fields,(Schema *)&root);
  MessageBuilder::setRoot<capnp::schema::Node::Reader>
            (&schemaBuilder.super_MessageBuilder,(Reader *)&fields);
  MessageBuilder::getRoot<capnp::schema::Node>(&root,&schemaBuilder.super_MessageBuilder);
  *(undefined8 *)root._builder.data = 0x8ed75a7469f04ce3;
  if (*(short *)((long)root._builder.data + 0xc) == 1) {
    field._builder.dataSize = root._builder.dataSize;
    field._builder.pointerCount = root._builder.pointerCount;
    field._builder._38_2_ = root._builder._38_2_;
    field._builder.data = root._builder.data;
    field._builder.pointers = root._builder.pointers;
    field._builder.capTable = root._builder.capTable;
    field._builder.segment = root._builder.segment;
    capnp::schema::Node::Struct::Builder::getFields(&fields,(Builder *)&field);
    local_1e0.container = &fields;
    for (local_1e0.index = 0; local_1e0.index != fields.builder.elementCount;
        local_1e0.index = local_1e0.index + 1) {
      IndexingIterator<capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Builder,_capnp::schema::Field::Builder>
      ::operator*(&field,&local_1e0);
      if (*(short *)((long)field._builder.data + 8) == 0) {
        local_178._builder.dataSize = field._builder.dataSize;
        local_178._builder.pointerCount = field._builder.pointerCount;
        local_178._builder._38_2_ = field._builder._38_2_;
        local_178._builder.data = field._builder.data;
        local_178._builder.pointers = field._builder.pointers;
        local_178._builder.segment = field._builder.segment;
        local_178._builder.capTable = field._builder.capTable;
        capnp::schema::Field::Slot::Builder::getType(&type,&local_178);
        if ((*type._builder.data == 0x10) &&
           (*(long *)((long)type._builder.data + 8) == -0x6a4cf22eb1fe2258)) {
          *(undefined8 *)((long)type._builder.data + 8) = 0x8ed75a7469f04ce3;
        }
      }
    }
  }
  StructBuilder::asReader(&root._builder);
  SchemaLoader::load(&loader,(Reader *)&fields);
  MallocMessageBuilder::~MallocMessageBuilder(&schemaBuilder);
  type._builder.segment = (SegmentBuilder *)(schemas::s_8ed75a7469f04ce3 + 0x48);
  Schema::getProto((Reader *)&schemaBuilder,(Schema *)&type);
  root._builder._0_16_ = capnp::schema::Node::Reader::getDisplayName((Reader *)&schemaBuilder);
  Schema::getProto((Reader *)&fields,&schema.super_Schema);
  field._builder._0_16_ = capnp::schema::Node::Reader::getDisplayName((Reader *)&fields);
  bVar2 = kj::StringPtr::operator==((StringPtr *)&root,(StringPtr *)&field);
  if (!bVar2 && kj::_::Debug::minSeverity < 3) {
    type._builder.segment = (SegmentBuilder *)(schemas::s_8ed75a7469f04ce3 + 0x48);
    Schema::getProto((Reader *)&schemaBuilder,(Schema *)&type);
    root._builder._0_16_ = capnp::schema::Node::Reader::getDisplayName((Reader *)&schemaBuilder);
    Schema::getProto((Reader *)&fields,&schema.super_Schema);
    field._builder._0_16_ = capnp::schema::Node::Reader::getDisplayName((Reader *)&fields);
    kj::_::Debug::log<char_const(&)[124],capnp::Text::Reader,capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0xe1,ERROR,
               "\"failed: expected \" \"(Schema::from<test::TestNewVersion>().getProto().getDisplayName()) == (schema.getProto().getDisplayName())\", Schema::from<test::TestNewVersion>().getProto().getDisplayName(), schema.getProto().getDisplayName()"
               ,(char (*) [124])
                "failed: expected (Schema::from<test::TestNewVersion>().getProto().getDisplayName()) == (schema.getProto().getDisplayName())"
               ,(Reader *)&root,(Reader *)&field);
  }
  Schema::requireUsableAs<capnproto_test::capnp::test::TestNewVersion>(&schema.super_Schema);
  SchemaLoader::~SchemaLoader(&loader);
  return;
}

Assistant:

TEST(SchemaLoader, Downgrade) {
  SchemaLoader loader;

  loader.loadCompiledTypeAndDependencies<test::TestNewVersion>();

  StructSchema schema = loader.get(typeId<test::TestNewVersion>()).asStruct();

  EXPECT_EQ(kj::str(Schema::from<test::TestNewVersion>().getProto()), kj::str(schema.getProto()));

  loadUnderAlternateTypeId<test::TestOldVersion>(loader, typeId<test::TestNewVersion>());

  // We kept the new version, because the replacement was older.
  EXPECT_EQ(Schema::from<test::TestNewVersion>().getProto().getDisplayName(),
            schema.getProto().getDisplayName());
  schema.requireUsableAs<test::TestNewVersion>();
}